

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

string * __thiscall pbrt::DDAMajorantIterator::ToString_abi_cxx11_(DDAMajorantIterator *this)

{
  char *unaff_RBP;
  string *in_RDI;
  float *unaff_R12;
  SampledSpectrum *unaff_R13;
  float *unaff_R14;
  float *unaff_R15;
  float *in_stack_00000040;
  float *in_stack_00000048;
  float *in_stack_00000050;
  float *in_stack_00000058;
  float *in_stack_00000060;
  int *in_stack_00000068;
  int *in_stack_00000070;
  int *in_stack_00000078;
  int *in_stack_00000080;
  int *in_stack_00000088;
  int *in_stack_00000090;
  int *in_stack_00000098;
  int *in_stack_000000a0;
  int *in_stack_000000a8;
  MajorantGrid **in_stack_000000b0;
  
  StringPrintf<float_const&,float_const&,pbrt::SampledSpectrum_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
            (unaff_RBP,unaff_R15,unaff_R14,unaff_R13,unaff_R12,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068,
             in_stack_00000070,in_stack_00000078,in_stack_00000080,in_stack_00000088,
             in_stack_00000090,in_stack_00000098,in_stack_000000a0,in_stack_000000a8,
             in_stack_000000b0);
  return in_RDI;
}

Assistant:

std::string DDAMajorantIterator::ToString() const {
    return StringPrintf("[ DDAMajorantIterator tMin: %f tMax: %f sigma_t: %s "
                        "nextCrossingT: [ %f %f %f ] deltaT: [ %f %f %f ] "
                        "step: [ %d %d %d ] voxelLimit: [ %d %d %d ] voxel: [ %d %d %d ] "
                        "grid: %p ]",
                        tMin, tMax, sigma_t, nextCrossingT[0], nextCrossingT[1],
                        nextCrossingT[2], deltaT[0], deltaT[1], deltaT[2], step[0],
                        step[1], step[2], voxelLimit[0], voxelLimit[1], voxelLimit[2],
                        voxel[0], voxel[1], voxel[2], grid);
}